

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_boost(envy_bios *bios)

{
  uint uVar1;
  envy_bios_power_boost_entry *peVar2;
  envy_bios_power_boost_subentry *peVar3;
  uint32_t sdata;
  envy_bios_power_boost_subentry *sub;
  uint local_30;
  uint uStack_2c;
  uint16_t tmp;
  uint32_t data;
  int err;
  int j;
  int i;
  envy_bios_power_boost *boost;
  envy_bios *bios_local;
  
  _j = &(bios->power).boost;
  uStack_2c = 0;
  if (_j->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    boost = (envy_bios_power_boost *)bios;
    bios_u8(bios,_j->offset,&(bios->power).boost.version);
    if (_j->version == '\x10') {
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 1,&_j->hlen);
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 2,&_j->rlen);
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 3,&_j->entriesnum);
      uStack_2c = uVar1 | uStack_2c;
      _j->ssz = '\0';
      _j->snr = '\0';
      _j->valid = (uStack_2c != 0 ^ 0xffU) & 1;
    }
    else {
      if (_j->version != '\x11') {
        fprintf(_stderr,"Unknown BOOST table version 0x%x\n",(ulong)_j->version);
        return -0x16;
      }
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 1,&_j->hlen);
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 2,&_j->rlen);
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 3,&_j->ssz);
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 4,&_j->snr);
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u8((envy_bios *)boost,_j->offset + 5,&_j->entriesnum);
      uStack_2c = uVar1 | uStack_2c;
      _j->valid = (uStack_2c != 0 ^ 0xffU) & 1;
    }
    peVar2 = (envy_bios_power_boost_entry *)malloc((ulong)_j->entriesnum * 0x18);
    _j->entries = peVar2;
    for (err = 0; err < (int)(uint)_j->entriesnum; err = err + 1) {
      local_30 = _j->offset + (uint)_j->hlen +
                 err * ((uint)_j->rlen + (uint)_j->snr * (uint)_j->ssz);
      uVar1 = bios_u16((envy_bios *)boost,local_30,(uint16_t *)((long)&sub + 6));
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u16((envy_bios *)boost,local_30 + 2,&_j->entries[err].min);
      uStack_2c = uVar1 | uStack_2c;
      uVar1 = bios_u16((envy_bios *)boost,local_30 + 4,&_j->entries[err].max);
      uStack_2c = uVar1 | uStack_2c;
      _j->entries[err].offset = local_30;
      _j->entries[err].pstate = (uint8_t)((int)(sub._6_2_ & 0x1e0) >> 5);
      peVar3 = (envy_bios_power_boost_subentry *)malloc((ulong)_j->snr * 0xc);
      _j->entries[err].entries = peVar3;
      for (data = 0; (int)data < (int)(uint)_j->snr; data = data + 1) {
        peVar3 = _j->entries[err].entries + (int)data;
        uVar1 = local_30 + _j->rlen + data * _j->ssz;
        peVar3->offset = uVar1;
        bios_u8((envy_bios *)boost,uVar1,&peVar3->domain);
        bios_u8((envy_bios *)boost,uVar1 + 1,&peVar3->percent);
        bios_u16((envy_bios *)boost,uVar1 + 2,&peVar3->min);
        bios_u16((envy_bios *)boost,uVar1 + 4,&peVar3->max);
      }
    }
    bios_local._4_4_ = 0;
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_boost(struct envy_bios *bios) {
	struct envy_bios_power_boost *boost = &bios->power.boost;
	int i, j, err = 0;

	if (!boost->offset)
		return -EINVAL;

	bios_u8(bios, boost->offset + 0x0, &boost->version);
	switch(boost->version) {
	case 0x10:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->entriesnum);
		boost->ssz = 0;
		boost->snr = 0;
		boost->valid = !err;
		break;
	case 0x11:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->ssz);
		err |= bios_u8(bios, boost->offset + 0x4, &boost->snr);
		err |= bios_u8(bios, boost->offset + 0x5, &boost->entriesnum);
		boost->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown BOOST table version 0x%x\n", boost->version);
		return -EINVAL;
	};

	boost->entries = malloc(boost->entriesnum * sizeof(struct envy_bios_power_boost_entry));

	for (i = 0; i < boost->entriesnum; i++) {
		uint32_t data = boost->offset + boost->hlen + i * (boost->rlen + (boost->snr * boost->ssz));

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);
		err |= bios_u16(bios, data + 0x2, &boost->entries[i].min);
		err |= bios_u16(bios, data + 0x4, &boost->entries[i].max);

		boost->entries[i].offset = data;
		boost->entries[i].pstate = (tmp & 0x01e0) >> 5;

		boost->entries[i].entries = malloc(boost->snr * sizeof(struct envy_bios_power_boost_subentry));

		for (j = 0; j < boost->snr; j++) {
			struct envy_bios_power_boost_subentry *sub = &boost->entries[i].entries[j];
			uint32_t sdata = data + boost->rlen + j * boost->ssz;

			sub->offset = sdata;
			bios_u8(bios, sdata + 0x0, &sub->domain);
			bios_u8(bios, sdata + 0x1, &sub->percent);
			bios_u16(bios, sdata + 0x2, &sub->min);
			bios_u16(bios, sdata + 0x4, &sub->max);
		}
	}

	return 0;
}